

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailsOnNotEqual::RunImpl(TestCheckCloseFailsOnNotEqual *this)

{
  TestResults *pTVar1;
  bool bVar2;
  int iVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_8f0 [2];
  TestDetails local_8b0;
  float local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [8];
  ScopedCurrentTest scopedResults;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  bool failure;
  TestCheckCloseFailsOnNotEqual *this_local;
  
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_880,(TestResults *)local_860,(TestDetails *)0x0);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  local_884 = 1.0;
  local_888 = 1.1;
  local_88c = 0.01;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar5,0xee);
  UnitTest::CheckClose<float,float,float>(pTVar1,&local_884,&local_888,&local_88c,&local_8b0);
  iVar3 = UnitTest::TestResults::GetFailureCount((TestResults *)local_860);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_880);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  bVar2 = UnitTest::Check<bool>(0 < iVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_8f0,*ppTVar5,0xf2);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_8f0,"failure");
  }
  return;
}

Assistant:

TEST(CheckCloseFailsOnNotEqual)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE (1.0f, 1.1f, 0.01f);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}